

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV4MeshBones(Parser *this,uint iNumBones,Mesh *mesh)

{
  bool bVar1;
  uint uVar2;
  string *out;
  uint iIndex;
  allocator<char> local_69;
  string local_68;
  Bone local_48;
  int local_24;
  Mesh *pMStack_20;
  int iDepth;
  Mesh *mesh_local;
  Parser *pPStack_10;
  uint iNumBones_local;
  Parser *this_local;
  
  local_24 = 0;
  pMStack_20 = mesh;
  mesh_local._4_4_ = iNumBones;
  pPStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"UNNAMED",&local_69);
  Bone::Bone(&local_48,&local_68);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::resize
            (&mesh->mBones,(ulong)iNumBones,&local_48);
  Bone::~Bone(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  do {
    while (*this->filePtr != '*') {
LAB_006313c1:
      if (*this->filePtr == '{') {
        local_24 = local_24 + 1;
      }
      else if (*this->filePtr == '}') {
        local_24 = local_24 + -1;
        if (local_24 == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_LIST chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_NAME",0xe);
    if ((!bVar1) || (bVar1 = SkipSpaces<char>(&this->filePtr), !bVar1)) goto LAB_006313c1;
    uVar2 = strtoul10(this->filePtr,&this->filePtr);
    if (uVar2 < mesh_local._4_4_) {
      out = &std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::operator[]
                       (&pMStack_20->mBones,(ulong)uVar2)->mName;
      bVar1 = ParseString(this,out,"*MESH_BONE_NAME");
      if (!bVar1) {
        SkipToNextToken(this);
      }
    }
    else {
      LogWarning(this,"Bone index is out of bounds");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBones(unsigned int iNumBones,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBones.resize(iNumBones, Bone("UNNAMED"));
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone with name ...
            if (TokenMatch(filePtr,"MESH_BONE_NAME" ,14))
            {
                // parse an index ...
                if(SkipSpaces(&filePtr))
                {
                    unsigned int iIndex = strtoul10(filePtr,&filePtr);
                    if (iIndex >= iNumBones)
                    {
                        LogWarning("Bone index is out of bounds");
                        continue;
                    }
                    if (!ParseString(mesh.mBones[iIndex].mName,"*MESH_BONE_NAME"))
                        SkipToNextToken();
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_BONE_LIST");
    }
}